

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O0

void p2sc_free_keyfile(p2sc_keyfile_t *k)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      g_key_file_free(*in_RDI);
    }
    g_free(in_RDI[1]);
    memset(in_RDI,0,0x10);
    g_free(in_RDI);
  }
  return;
}

Assistant:

void p2sc_free_keyfile(p2sc_keyfile_t *k) {
    if (k) {
        if (k->key)
            g_key_file_free(k->key);
        g_free(k->name);
        memset(k, 0, sizeof *k);
        g_free(k);
    }
}